

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

MAP_RESULT Map_ContainsValue(MAP_HANDLE handle,char *value,_Bool *valueExists)

{
  char **ppcVar1;
  size_t sVar2;
  _Bool _Var3;
  int iVar4;
  LOGGER_LOG p_Var5;
  MAP_RESULT MVar6;
  size_t i;
  size_t sVar7;
  
  if ((value == (char *)0x0 || handle == (MAP_HANDLE)0x0) || valueExists == (_Bool *)0x0) {
    p_Var5 = xlogging_get_log_function();
    MVar6 = MAP_INVALIDARG;
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/map.c"
                ,"Map_ContainsValue",0x213,1,"result = %s%s (%d)","",MAP_RESULTStringStorage[3],3);
    }
  }
  else {
    ppcVar1 = handle->values;
    if (ppcVar1 == (char **)0x0) {
LAB_00166231:
      _Var3 = false;
    }
    else {
      sVar2 = handle->count;
      sVar7 = 0;
      do {
        if (sVar2 == sVar7) goto LAB_00166231;
        iVar4 = strcmp(ppcVar1[sVar7],value);
        sVar7 = sVar7 + 1;
      } while (iVar4 != 0);
      _Var3 = true;
    }
    *valueExists = _Var3;
    MVar6 = MAP_OK;
  }
  return MVar6;
}

Assistant:

MAP_RESULT Map_ContainsValue(MAP_HANDLE handle, const char* value, bool* valueExists)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_027: [If parameter handle, value or valueExists is NULL then Map_ContainsValue shall return MAP_INVALIDARG.] */
    if (
        (handle == NULL) ||
        (value == NULL) ||
        (valueExists == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        /*Codes_SRS_MAP_02_028: [Otherwise, if a pair <key, value> has its value equal to the parameter value, the Map_ContainsValue shall return MAP_OK and shall write in valueExists "true".]*/
        /*Codes_SRS_MAP_02_029: [Otherwise, if such a <key, value> does not exist, then Map_ContainsValue shall return MAP_OK and shall write in valueExists "false".] */
        *valueExists = (findValue(handleData, value) != NULL) ? true : false;
        result = MAP_OK;
    }
    return result;
}